

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O3

stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* util::rpn_parse_v2(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *__return_storage_ptr__,string *expr)

{
  ulong uVar1;
  pointer pcVar2;
  byte bVar3;
  int iVar4;
  op_stack_t *poVar5;
  long lVar6;
  ulong uVar7;
  _Map_pointer ppoVar8;
  _Elt_pointer poVar9;
  string *psVar10;
  int iVar11;
  string *str;
  _Map_pointer __n;
  _Map_pointer ppoVar12;
  bool bVar13;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stack;
  Lexer lexer;
  stringstream ss;
  stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> local_358;
  _Map_pointer local_300;
  value_type local_2f8;
  string *local_2d0;
  string *local_2c8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c0;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  Lexer local_210;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_268._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_268,0);
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_map_size = 8;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)operator_new(0x40);
  ppoVar12 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
             super__Deque_impl_data._M_map + 3;
  ppoVar8 = ppoVar12;
  do {
    poVar5 = (op_stack_t *)operator_new(0x1e0);
    *ppoVar8 = poVar5;
    bVar13 = ppoVar8 < ppoVar12;
    ppoVar8 = ppoVar8 + 1;
  } while (bVar13);
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = *ppoVar12;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur + 0xc;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = ppoVar12;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last =
       local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = ppoVar12;
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)expr,_S_out|_S_in);
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (string *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_last = (string *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur = (string *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_first = (string *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_2b8,0);
  Lexer::Lexer(&local_210,(istream *)local_1b8);
  Lexer::
  Lex<std::front_insert_iterator<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_210,
             (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2b8);
  if (local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_300 = local_2b8._M_impl.super__Deque_impl_data._M_start._M_node;
    local_2d0 = local_2b8._M_impl.super__Deque_impl_data._M_start._M_first;
    local_2c8 = local_2b8._M_impl.super__Deque_impl_data._M_start._M_last;
    str = local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_2c0 = (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__return_storage_ptr__;
    do {
      rpn_map_multichar_op(str);
      bVar3 = *(str->_M_dataplus)._M_p;
      iVar11 = 2;
      if (0x5d < bVar3) {
        if (bVar3 == 0x5e) {
          iVar11 = 7;
        }
        else if (bVar3 == 0x7c) {
          iVar11 = 8;
        }
        else if (bVar3 != 0x7e) goto switchD_00191d8a_caseD_22;
        goto switchD_00191d8a_caseD_21;
      }
      switch(bVar3) {
      case 0x21:
        break;
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x27:
      case 0x2e:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
switchD_00191d8a_caseD_22:
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_268,str);
        goto LAB_00191f7b;
      case 0x25:
      case 0x2a:
      case 0x2f:
        iVar11 = 3;
        break;
      case 0x26:
        iVar11 = 9;
        break;
      case 0x28:
        while (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur) {
          if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1][0xb].prec == 99) goto LAB_00192038;
            poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
          }
          else {
            poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur[-1].prec == 99) {
LAB_00192038:
              std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                        (&local_358);
              break;
            }
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_268,&poVar9[-1].tok);
          std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                    (&local_358);
        }
        goto LAB_00191f7b;
      case 0x29:
        local_2f8.tok._M_dataplus._M_p = (pointer)&local_2f8.tok.field_2;
        pcVar2 = (str->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,pcVar2,pcVar2 + str->_M_string_length);
        local_2f8.prec = 99;
        std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::push
                  (&local_358,&local_2f8);
        goto LAB_00191f5f;
      case 0x2b:
      case 0x2d:
        iVar11 = 4;
        break;
      case 0x2c:
        while (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur) {
          if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            if (0x62 < local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0xb].prec) break;
            poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
          }
          else {
            poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (0x62 < local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_cur[-1].prec) break;
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_268,&poVar9[-1].tok);
          std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                    (&local_358);
        }
        goto LAB_00191f7b;
      case 0x3c:
      case 0x3e:
switchD_00191d8a_caseD_3c:
        iVar11 = 5;
        break;
      case 0x3d:
switchD_00191d8a_caseD_3d:
        iVar11 = 6;
        break;
      default:
        switch(bVar3) {
        case 2:
          goto switchD_00191d8a_caseD_3d;
        case 3:
        case 4:
          goto switchD_00191d8a_caseD_3c;
        case 5:
          iVar11 = 10;
          break;
        case 6:
          iVar11 = 0xb;
          break;
        default:
          goto switchD_00191d8a_caseD_22;
        }
      }
switchD_00191d8a_caseD_21:
      lVar6 = (long)str - (long)local_2d0 >> 5;
      uVar1 = lVar6 + 1;
      if (lVar6 < -1) {
        uVar7 = (long)uVar1 >> 4;
LAB_00191de1:
        if ((string *)
            ((long)&(local_300[uVar7]->_M_dataplus)._M_p + (ulong)(((uint)uVar1 & 0xf) << 5)) ==
            local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur) goto LAB_00191e4a;
        psVar10 = local_300[uVar7] + uVar1 + uVar7 * -0x10;
LAB_00191e0d:
        bVar3 = *(psVar10->_M_dataplus)._M_p;
        if (((((ulong)bVar3 < 0x3f) && ((0x7000bf620000007cU >> ((ulong)bVar3 & 0x3f) & 1) != 0)) ||
            ((bVar3 - 0x5e < 0x21 && ((0x140000001U >> ((ulong)(bVar3 - 0x5e) & 0x3f) & 1) != 0))))
           && (iVar4 = std::__cxx11::string::compare((char *)psVar10), iVar4 != 0)) {
          bVar3 = *(str->_M_dataplus)._M_p;
          goto LAB_00191e4a;
        }
        while (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur) {
          if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            if (iVar11 <= local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0xb].prec) break;
            poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
          }
          else {
            poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (iVar11 <= local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur[-1].prec) break;
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_268,&poVar9[-1].tok);
          std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                    (&local_358);
        }
      }
      else {
        if (0xf < uVar1) {
          uVar7 = uVar1 >> 4;
          goto LAB_00191de1;
        }
        psVar10 = str + 1;
        if (psVar10 != local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur) goto LAB_00191e0d;
LAB_00191e4a:
        if (bVar3 == 0x2d) {
          std::__cxx11::string::_M_replace_aux((ulong)str,0,str->_M_string_length,'\x01');
        }
        iVar11 = 1;
        while (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur) {
          if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            if (1 < local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1][0xb].prec) break;
            poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
          }
          else {
            poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (1 < local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur[-1].prec) break;
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_268,&poVar9[-1].tok);
          std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                    (&local_358);
        }
      }
      local_2f8.tok._M_dataplus._M_p = (pointer)&local_2f8.tok.field_2;
      pcVar2 = (str->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,pcVar2,pcVar2 + str->_M_string_length);
      local_2f8.prec = iVar11;
      std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::push
                (&local_358,&local_2f8);
LAB_00191f5f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8.tok._M_dataplus._M_p != &local_2f8.tok.field_2) {
        operator_delete(local_2f8.tok._M_dataplus._M_p,
                        local_2f8.tok.field_2._M_allocated_capacity + 1);
      }
LAB_00191f7b:
      __return_storage_ptr__ =
           (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_2c0;
      str = str + 1;
      if (str == local_2c8) {
        str = local_300[1];
        local_300 = local_300 + 1;
        local_2c8 = str + 0x10;
        local_2d0 = str;
      }
    } while (str != local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur);
    if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      do {
        if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1][0xb].prec - 1U < 0x61) {
            poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            goto LAB_00192159;
          }
        }
        else {
          poVar9 = local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur[-1].prec - 1U < 0x61) {
LAB_00192159:
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_268,&poVar9[-1].tok);
          }
        }
        std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                  (&local_358);
      } while (local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               local_358.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur);
    }
  }
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__return_storage_ptr__,&local_268);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_210.token_buffer.c);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_2b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::~stack(&local_358);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_268);
  return (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__return_storage_ptr__;
}

Assistant:

std::stack<std::string> rpn_parse_v2(std::string expr)
{
	static const int prec_value = 0;
	static const int prec_unary = 1;
	static const int prec_comma = 98;
	static const int prec_paren = 99;

	auto prec_is_op = [](int prec) { return prec > 0 && prec < 98; };

	auto op_prec = [](char c)
	{
		switch (c)
		{
			case '!': case '~':
				return 2;
			case '*': case '/': case '%':
				return 3;
			case '+': case '-':
				return 4;
			case '<': case op_lte: case '>': case op_gte:
				return 5;
			case '=': case op_ne:
				return 6;
			case '^':
				return 7;
			case '|':
				return 8;
			case '&':
				return 9;
			case op_and:
				return 10;
			case op_or:
				return 11;
			case ',':
				return prec_comma;
			case '(': case ')':
				return prec_paren;
		}

		return prec_value;
	};

	// The result is built up in reverse order
	std::deque<std::string> stack;
	struct op_stack_t { std::string tok; int prec; };
	std::stack<op_stack_t> op_stack;

	std::stringstream ss(expr);
	std::deque<std::string> tokens;
	Lexer lexer(ss);
	lexer.Lex(std::front_inserter(tokens));

	for (auto it = tokens.begin(); it != tokens.end(); ++it)
	{
		auto& tok = *it;
		rpn_map_multichar_op(tok);
		int prec = op_prec(tok[0]);

		if (prec == prec_value)
		{
			stack.push_front(tok);
			continue;
		}

		if (prec == prec_paren && tok[0] == ')')
		{
			op_stack.push({tok, prec});
			continue;
		}

		if (prec_is_op(prec))
		{
			bool is_unary = false;

			if ((it + 1) == tokens.end())
			{
				is_unary = true;
			}
			else
			{
				auto& prev_tok = *(it + 1);
				int prev_prec = op_prec(prev_tok[0]);

				if (prev_prec != 0 && prev_tok != ")")
					is_unary = true;
			}

			if (is_unary)
			{
				prec = prec_unary;

				if (tok[0] == '-')
					tok = op_neg;

				while (!op_stack.empty() && (op_stack.top().prec <= prec))
				{
					stack.push_front(op_stack.top().tok);
					op_stack.pop();
				}
			}
			else
			{
				while (!op_stack.empty() && (op_stack.top().prec < prec))
				{
					stack.push_front(op_stack.top().tok);
					op_stack.pop();
				}
			}
		}
		else if (prec == prec_comma)
		{
			while (!op_stack.empty() && (op_stack.top().prec <= prec))
			{
				stack.push_front(op_stack.top().tok);
				op_stack.pop();
			}
		}
		else if (prec == prec_paren)
		{
			while (!op_stack.empty())
			{
				if (op_stack.top().prec == prec_paren)
				{
					op_stack.pop();
					break;
				}

				stack.push_front(op_stack.top().tok);
				op_stack.pop();
			}
		}

		if (prec_is_op(prec))
			op_stack.push({tok, prec});
	}

	for (; !op_stack.empty(); op_stack.pop())
	{
		int prec = op_stack.top().prec;
		if (prec_is_op(prec))
			stack.push_front(op_stack.top().tok);
	}

	return std::stack<std::string>(std::move(stack));
}